

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracyOpenGL.hpp
# Opt level: O1

void __thiscall tracy::GpuCtx::Collect(GpuCtx *this)

{
  ulong uVar1;
  Block *pBVar2;
  uint uVar3;
  ExplicitProducer *pEVar4;
  ExplicitProducer *extraout_RAX;
  ExplicitProducer *pEVar5;
  ExplicitProducer *extraout_RAX_00;
  ulong uVar6;
  ulong uVar7;
  GLint available;
  uint64_t time;
  int local_3c;
  undefined8 local_38;
  
  pEVar4 = GetToken();
  uVar1 = (pEVar4->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  pEVar5 = pEVar4;
  if ((uVar1 & 0xffff) == 0) {
    moodycamel::ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar4,uVar1);
    pEVar5 = extraout_RAX;
  }
  pBVar2 = (pEVar4->super_ProducerBase).tailBlock;
  uVar6 = (ulong)(uint)((int)(uVar1 & 0xffff) << 5);
  (pBVar2->field_0).elements[uVar6] = '\x0f';
  uVar7 = rdtsc();
  *(ulong *)((long)&pBVar2->field_0 + uVar6 + 1) =
       (uVar7 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar5 >> 0x20),(int)uVar7);
  *(SourceLocationData **)((long)&pBVar2->field_0 + uVar6 + 9) =
       &Collect::__tracy_source_location144;
  (pEVar4->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar1 + 1;
  if ((this->m_tail != this->m_head) && (uVar3 = this->m_tail, uVar3 != this->m_head)) {
    do {
      (*gl3wProcs.ptr[0xf9])((ulong)this->m_query[uVar3],0x8867,&local_3c);
      if (local_3c == 0) break;
      (*gl3wProcs.ptr[0xfa])((ulong)this->m_query[this->m_tail],0x8866,&local_38);
      pEVar5 = GetToken();
      uVar1 = (pEVar5->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
      if ((uVar1 & 0xffff) == 0) {
        moodycamel::
        ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
        ExplicitProducer::enqueue_begin_alloc(pEVar5,uVar1);
      }
      pBVar2 = (pEVar5->super_ProducerBase).tailBlock;
      uVar7 = (ulong)(uint)((int)(uVar1 & 0xffff) << 5);
      (pBVar2->field_0).elements[uVar7] = '.';
      *(undefined8 *)((long)&pBVar2->field_0 + uVar7 + 1) = local_38;
      *(short *)((long)&pBVar2->field_0 + uVar7 + 9) = (short)this->m_tail;
      (pBVar2->field_0).elements[uVar7 + 0xb] = this->m_context;
      (pEVar5->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar1 + 1;
      uVar3 = this->m_tail + 1 & 0xffff;
      this->m_tail = uVar3;
    } while (uVar3 != this->m_head);
  }
  pEVar4 = GetToken();
  uVar1 = (pEVar4->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  pEVar5 = pEVar4;
  if ((uVar1 & 0xffff) == 0) {
    moodycamel::ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar4,uVar1);
    pEVar5 = extraout_RAX_00;
  }
  pBVar2 = (pEVar4->super_ProducerBase).tailBlock;
  uVar6 = (ulong)(uint)((int)(uVar1 & 0xffff) << 5);
  (pBVar2->field_0).elements[uVar6] = '\x11';
  uVar7 = rdtsc();
  *(ulong *)((long)&pBVar2->field_0 + uVar6 + 1) =
       (uVar7 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar5 >> 0x20),(int)uVar7);
  (pEVar4->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar1 + 1;
  return;
}

Assistant:

void Collect()
    {
        ZoneScopedC( Color::Red4 );

        if( m_tail == m_head ) return;

#ifdef TRACY_ON_DEMAND
        if( !GetProfiler().IsConnected() )
        {
            m_head = m_tail = 0;
            return;
        }
#endif

        while( m_tail != m_head )
        {
            GLint available;
            glGetQueryObjectiv( m_query[m_tail], GL_QUERY_RESULT_AVAILABLE, &available );
            if( !available ) return;

            uint64_t time;
            glGetQueryObjectui64v( m_query[m_tail], GL_QUERY_RESULT, &time );

            TracyLfqPrepare( QueueType::GpuTime );
            MemWrite( &item->gpuTime.gpuTime, (int64_t)time );
            MemWrite( &item->gpuTime.queryId, (uint16_t)m_tail );
            MemWrite( &item->gpuTime.context, m_context );
            TracyLfqCommit;

            m_tail = ( m_tail + 1 ) % QueryCount;
        }
    }